

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree.cc
# Opt level: O0

int build_tree(int *parent,uint16_t *kid_count,size_t source_count,int offset)

{
  int iVar1;
  int offset_00;
  int iVar2;
  int iVar3;
  int in_ECX;
  uint16_t *in_RDX;
  int *in_RSI;
  long in_RDI;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  int right_child;
  int right_offset;
  size_t right_count;
  int oroot;
  int left_child;
  int left_offset;
  int left_count;
  int root;
  int height;
  undefined4 local_4;
  
  if (in_RDX == (uint16_t *)0x1) {
    *(undefined2 *)((long)in_RSI + (long)in_ECX * 2) = 0;
    local_4 = in_ECX;
  }
  else {
    auVar6._8_4_ = (int)((ulong)in_RDX >> 0x20);
    auVar6._0_8_ = in_RDX;
    auVar6._12_4_ = 0x45300000;
    dVar4 = log((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)in_RDX) - 4503599627370496.0));
    dVar5 = log(2.0);
    dVar4 = floor(dVar4 / dVar5);
    iVar1 = (int)dVar4;
    offset_00 = (1 << ((byte)iVar1 & 0x1f)) + -1;
    iVar3 = offset_00;
    iVar2 = build_tree(in_RSI,in_RDX,CONCAT44(in_ECX,iVar1),offset_00);
    local_4 = iVar3 + in_ECX;
    *(int *)(in_RDI + (long)iVar2 * 4) = local_4;
    if ((long)in_RDX - (long)offset_00 == 1) {
      *(undefined2 *)((long)in_RSI + (long)local_4 * 2) = 1;
    }
    else {
      iVar3 = build_tree(in_RSI,in_RDX,CONCAT44(in_ECX,iVar1),iVar3);
      *(int *)(in_RDI + (long)iVar3 * 4) = local_4;
      *(undefined2 *)((long)in_RSI + (long)local_4 * 2) = 2;
    }
  }
  return local_4;
}

Assistant:

int build_tree(int* parent, uint16_t* kid_count, size_t source_count, int offset)
{
  if (source_count == 1)
  {
    kid_count[offset] = 0;
    return offset;
  }

  int height = (int)floor(log((double)source_count) / log(2.0));
  int root = (1 << height) - 1;
  int left_count = root;
  int left_offset = offset;
  int left_child = build_tree(parent, kid_count, left_count, left_offset);
  int oroot = root + offset;
  parent[left_child] = oroot;

  size_t right_count = source_count - left_count - 1;
  if (right_count > 0)
  {
    int right_offset = oroot + 1;

    int right_child = build_tree(parent, kid_count, right_count, right_offset);
    parent[right_child] = oroot;
    kid_count[oroot] = 2;
  }
  else
    kid_count[oroot] = 1;

  return oroot;
}